

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O0

bool ApprovalTests::StringUtils::beginsWith(string *value,string *beginning)

{
  ulong uVar1;
  ulong uVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first2;
  undefined1 local_1;
  
  uVar1 = ::std::__cxx11::string::size();
  uVar2 = ::std::__cxx11::string::size();
  if (uVar1 < uVar2) {
    local_1 = false;
  }
  else {
    __first1._M_current = (char *)::std::__cxx11::string::begin();
    __last1._M_current = (char *)::std::__cxx11::string::end();
    __first2._M_current = (char *)::std::__cxx11::string::begin();
    local_1 = ::std::
              equal<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                        (__first1,__last1,__first2);
  }
  return local_1;
}

Assistant:

APPROVAL_TESTS_NO_DISCARD
    bool StringUtils::beginsWith(std::string value, std::string beginning)
    {
        if (value.size() < beginning.size())
        {
            return false;
        }
        return std::equal(beginning.begin(), beginning.end(), value.begin());
    }